

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

BuildMode parsemode(char *mode)

{
  int iVar1;
  BuildMode local_1c;
  int i;
  char *mode_local;
  
  local_1c = BUILD_elfasm;
  while( true ) {
    if (modenames[(int)local_1c] == (char *)0x0) {
      usage();
      return ~BUILD_elfasm;
    }
    iVar1 = strcmp(mode,modenames[(int)local_1c]);
    if (iVar1 == 0) break;
    local_1c = local_1c + BUILD_coffasm;
  }
  return local_1c;
}

Assistant:

static BuildMode parsemode(const char *mode)
{
  int i;
  for (i = 0; modenames[i]; i++)
    if (!strcmp(mode, modenames[i]))
      return (BuildMode)i;
  usage();
  return (BuildMode)-1;
}